

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cConditionalRenderInvertedTests.cpp
# Opt level: O1

void __thiscall gl4cts::ConditionalRenderInverted::CoverageTest::clean(CoverageTest *this)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x458))(1,&this->m_qo_id);
  this->m_qo_id = 0;
  do {
    iVar2 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  } while (iVar2 != 0);
  return;
}

Assistant:

void gl4cts::ConditionalRenderInverted::CoverageTest::clean()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Clean query object. */
	gl.deleteQueries(1, &m_qo_id);

	m_qo_id = 0;

	/* Make sure no errors are left. */
	while (gl.getError())
		;
}